

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  int iVar11;
  result rVar12;
  byte bVar13;
  byte bVar14;
  undefined8 extraout_RDX;
  long lVar15;
  long lVar16;
  size_t __len;
  ulong uVar17;
  size_t new_size;
  uint64_t uVar18;
  ulong uVar19;
  ulong uVar20;
  uint64_t divisor;
  boundaries bVar21;
  fp fVar22;
  fp fVar23;
  ulong uStack_b0;
  int local_98;
  int cached_exp10;
  ulong local_90;
  fp local_88;
  ulong local_78;
  double local_70;
  buffer<char> *local_68;
  fixed_handler handler;
  fp local_40;
  
  uVar19 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar19 == 0x200000000) {
      buffer<char>::resize(buf,(ulong)(uint)precision);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  if ((specs._4_4_ >> 0x14 & 1) == 0) {
    iVar11 = snprintf_float<double>(value,precision,specs,buf);
    return iVar11;
  }
  local_98 = 0;
  cached_exp10 = 0;
  if (precision == -1) {
    local_88.f = 0;
    local_88.e = 0;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      local_70 = value;
      bVar21 = fp::assign_with_boundaries<double>(&local_88,value);
    }
    else {
      local_70 = value;
      bVar21 = fp::assign_float_with_boundaries<double>(&local_88,value);
    }
    fVar22._8_8_ = bVar21.upper;
    fVar22.f = (ulong)(uint)local_88.e;
    fVar23 = normalize<0>((internal *)local_88.f,fVar22);
    local_88.f = fVar23.f;
    local_88.e = fVar23.e;
    fVar23 = get_cached_power(-0x7c - local_88.e,&cached_exp10);
    uVar19 = fVar23.f;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar19;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_88.f;
    local_88.f = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    cVar10 = (char)fVar23.e + (char)local_88.e;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar19;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar21.lower;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar19;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = fVar22._8_8_;
    lVar16 = SUB168(auVar5 * auVar9,8);
    lVar15 = -(SUB168(auVar5 * auVar9,0) >> 0x3f);
    uVar19 = lVar16 + lVar15 + 1;
    handler.buf = buf->ptr_;
    handler.size = 0;
    handler._16_8_ = uVar19 - local_88.f;
    bVar13 = -cVar10 - 0x40;
    bVar14 = -cVar10;
    divisor = 1L << (bVar14 & 0x3f);
    uVar18 = ((SUB168(auVar4 * auVar8,0) >> 0x3f) - SUB168(auVar4 * auVar8,8)) + lVar16 + lVar15 + 2
    ;
    local_90 = divisor - 1;
    uVar17 = local_90 & uVar19;
    uVar19 = uVar19 >> (bVar14 & 0x3f);
    local_88.e = fVar23.e + local_88.e + 0x40;
    local_68 = buf;
    local_98 = count_digits((uint32_t)uVar19);
    do {
      iVar11 = local_98 + -1;
      switch(iVar11) {
      case 0:
        cVar10 = (char)uVar19;
        uVar19 = 0;
        goto LAB_00119f30;
      case 1:
        uStack_b0 = 10;
        break;
      case 2:
        uStack_b0 = 100;
        break;
      case 3:
        uStack_b0 = 1000;
        break;
      case 4:
        uStack_b0 = 10000;
        break;
      case 5:
        uStack_b0 = 100000;
        break;
      case 6:
        uStack_b0 = 1000000;
        break;
      case 7:
        uStack_b0 = 10000000;
        break;
      case 8:
        uStack_b0 = 100000000;
        break;
      case 9:
        uStack_b0 = 1000000000;
        break;
      default:
        cVar10 = '\0';
        goto LAB_00119f30;
      }
      cVar10 = (char)((uVar19 & 0xffffffff) / uStack_b0);
      uVar19 = (uVar19 & 0xffffffff) % uStack_b0;
LAB_00119f30:
      lVar15 = (long)local_98;
      local_98 = iVar11;
      rVar12 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,cVar10 + '0',
                          *(long *)(basic_data<void>::pow10_exponents + lVar15 * 8 + 0xa8) <<
                          (bVar13 & 0x3f),((uVar19 & 0xffffffff) << (bVar13 & 0x3f)) + uVar17,uVar18
                          ,iVar11,true);
      uVar20 = local_90;
      if (rVar12 != more) goto LAB_00119fcb;
    } while (0 < local_98);
    do {
      uVar19 = uVar17 * 10;
      uVar18 = uVar18 * 10;
      uVar17 = uVar19 & uVar20;
      local_98 = local_98 + -1;
      rVar12 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,(char)(uVar19 >> (bVar13 & 0x3f)) + '0'
                          ,divisor,uVar17,uVar18,local_98,false);
    } while (rVar12 == more);
LAB_00119fcb:
    new_size = (size_t)(uint)handler.size;
    if (rVar12 == error) {
      local_98 = local_98 + ~cached_exp10 + handler.size;
      fallback_format<double>(local_70,local_68,&local_98);
      return local_98;
    }
LAB_0011a044:
    buffer<char>::resize(local_68,new_size);
    local_98 = local_98 - cached_exp10;
  }
  else {
    if (precision < 0x12) {
      local_70 = value;
      fp::assign<double,_0>(&local_40,value);
      fVar23.f = (ulong)(uint)local_40.e;
      fVar23._8_8_ = extraout_RDX;
      fVar22 = normalize<0>((internal *)local_40.f,fVar23);
      local_90 = fVar22.f;
      fVar23 = get_cached_power(-0x7c - fVar22.e,&cached_exp10);
      handler.buf = buf->ptr_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar23.f;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_90;
      handler.size = 0;
      uVar20 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      iVar11 = fVar23.e + fVar22.e;
      handler.fixed = uVar19 == 0x200000000;
      handler.exp10 = -cached_exp10;
      local_78 = CONCAT44(local_78._4_4_,iVar11);
      bVar13 = -(char)iVar11;
      local_90 = 1L << (bVar13 & 0x3f);
      uVar17 = uVar20 >> (bVar13 & 0x3f);
      local_68 = buf;
      handler.precision = precision;
      local_98 = count_digits((uint32_t)uVar17);
      rVar12 = fixed_handler::on_start
                         (&handler,*(long *)(basic_data<void>::pow10_exponents +
                                            (long)local_98 * 8 + 0xa8) << (bVar13 & 0x3f),
                          uVar20 / 10,10,&local_98);
      if (rVar12 == more) {
        bVar13 = -(char)local_78 - 0x40;
        local_78 = local_90 - 1;
        uVar20 = uVar20 & local_78;
        uVar18 = 1;
        do {
          iVar11 = local_98 + -1;
          switch(iVar11) {
          case 0:
            cVar10 = (char)uVar17;
            uVar17 = 0;
            goto LAB_00119d0d;
          case 1:
            uStack_b0 = 10;
            break;
          case 2:
            uStack_b0 = 100;
            break;
          case 3:
            uStack_b0 = 1000;
            break;
          case 4:
            uStack_b0 = 10000;
            break;
          case 5:
            uStack_b0 = 100000;
            break;
          case 6:
            uStack_b0 = 1000000;
            break;
          case 7:
            uStack_b0 = 10000000;
            break;
          case 8:
            uStack_b0 = 100000000;
            break;
          case 9:
            uStack_b0 = 1000000000;
            break;
          default:
            cVar10 = '\0';
            goto LAB_00119d0d;
          }
          cVar10 = (char)((uVar17 & 0xffffffff) / uStack_b0);
          uVar17 = (uVar17 & 0xffffffff) % uStack_b0;
LAB_00119d0d:
          lVar15 = (long)local_98;
          local_98 = iVar11;
          rVar12 = fixed_handler::on_digit
                             (&handler,cVar10 + '0',
                              *(long *)(basic_data<void>::pow10_exponents + lVar15 * 8 + 0xa8) <<
                              (bVar13 & 0x3f),((uVar17 & 0xffffffff) << (bVar13 & 0x3f)) + uVar20,1,
                              iVar11,true);
          if (rVar12 != more) goto LAB_00119db2;
        } while (0 < local_98);
        do {
          uVar17 = uVar20 * 10;
          uVar18 = uVar18 * 10;
          uVar20 = uVar17 & local_78;
          local_98 = local_98 + -1;
          rVar12 = fixed_handler::on_digit
                             (&handler,(char)(uVar17 >> (bVar13 & 0x3f)) + '0',local_90,uVar20,
                              uVar18,local_98,false);
        } while (rVar12 == more);
      }
LAB_00119db2:
      buf = local_68;
      value = local_70;
      if (rVar12 != error) {
        uVar17 = (ulong)(uint)handler.size;
        if (0 < handler.size && uVar19 != 0x200000000) {
          uVar17 = (ulong)(uint)handler.size;
          do {
            iVar11 = local_98 + 1;
            if (local_68->ptr_[uVar17 - 1] != '0') goto LAB_0011a03f;
            bVar1 = 1 < uVar17;
            uVar17 = uVar17 - 1;
            local_98 = iVar11;
          } while (bVar1);
          uVar17 = 0;
        }
LAB_0011a03f:
        new_size = uVar17 & 0xffffffff;
        goto LAB_0011a044;
      }
    }
    local_98 = snprintf_float<double>(value,precision,specs,buf);
  }
  return local_98;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>(), "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision != -1) {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  } else {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  }
  return exp - cached_exp10;
}